

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O2

exr_result_t exr_attr_chlist_destroy(exr_context_t ctxt,exr_attr_chlist_t *clist)

{
  exr_attr_chlist_entry_t *peVar1;
  _internal_exr_context *pctxt;
  ulong uVar2;
  ulong uVar3;
  
  if (ctxt != (exr_context_t)0x0) {
    if (clist != (exr_attr_chlist_t *)0x0) {
      peVar1 = clist->entries;
      uVar3 = 0;
      uVar2 = (ulong)(uint)clist->num_channels;
      if (clist->num_channels < 1) {
        uVar2 = uVar3;
      }
      for (; uVar2 * 0x20 != uVar3; uVar3 = uVar3 + 0x20) {
        exr_attr_string_destroy(ctxt,(exr_attr_string_t *)(peVar1->reserved + (uVar3 - 0x15)));
      }
      if (peVar1 != (exr_attr_chlist_entry_t *)0x0) {
        (**(code **)(ctxt + 0x60))(peVar1);
      }
      clist->num_channels = 0;
      clist->num_alloced = 0;
      clist->entries = (exr_attr_chlist_entry_t *)0x0;
    }
    return 0;
  }
  return 2;
}

Assistant:

exr_result_t
exr_attr_chlist_destroy (exr_context_t ctxt, exr_attr_chlist_t* clist)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (clist)
    {
        exr_attr_chlist_t        nil = {0};
        int                      nc  = clist->num_channels;
        exr_attr_chlist_entry_t* entries =
            EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

        for (int i = 0; i < nc; ++i)
            exr_attr_string_destroy (ctxt, &(entries[i].name));
        if (entries) pctxt->free_fn (entries);
        *clist = nil;
    }
    return EXR_ERR_SUCCESS;
}